

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

int share_listen_accepting(Plug *plug,accept_fn_t constructor,accept_ctx_t ctx)

{
  uint uVar1;
  ssh_sharing_state *sharestate_00;
  ssh_sharing_connstate *cs_00;
  Socket *pSVar2;
  char *pcVar3;
  tree234 *ptVar4;
  SocketPeerInfo *pi;
  bool bVar5;
  char *local_68;
  SocketPeerInfo *peerinfo;
  char *err;
  ssh_sharing_connstate *cs;
  ssh_sharing_state *sharestate;
  accept_fn_t constructor_local;
  Plug *plug_local;
  accept_ctx_t ctx_local;
  
  sharestate_00 = (ssh_sharing_state *)(plug + -6);
  cs_00 = (ssh_sharing_connstate *)safemalloc(1,0x4088,0);
  (cs_00->plug).vt = &ssh_sharing_conn_plugvt;
  cs_00->parent = sharestate_00;
  uVar1 = share_find_unused_id(sharestate_00,*(uint *)&plug[-3].vt);
  cs_00->id = uVar1;
  if (uVar1 == 0) {
    uVar1 = share_find_unused_id(sharestate_00,1);
    cs_00->id = uVar1;
    if (uVar1 == 0) {
      safefree(cs_00);
      return 1;
    }
  }
  *(uint *)&plug[-3].vt = cs_00->id + 1;
  if (*(int *)&plug[-3].vt == 0) {
    *(int *)&plug[-3].vt = *(int *)&plug[-3].vt + 1;
  }
  pSVar2 = (*constructor)(ctx,&cs_00->plug);
  cs_00->sock = pSVar2;
  pcVar3 = sk_socket_error(cs_00->sock);
  if (pcVar3 == (char *)0x0) {
    sk_set_frozen(cs_00->sock,false);
    add234(cs_00->parent->connections,cs_00);
    cs_00->sent_verstring = false;
    if (plug[-1].vt != (PlugVtable *)0x0) {
      share_send_verstring(cs_00);
    }
    cs_00->got_verstring = false;
    cs_00->recvlen = 0;
    cs_00->crLine = 0;
    ptVar4 = newtree234(share_halfchannel_cmp);
    cs_00->halfchannels = ptVar4;
    ptVar4 = newtree234(share_channel_us_cmp);
    cs_00->channels_by_us = ptVar4;
    ptVar4 = newtree234(share_channel_server_cmp);
    cs_00->channels_by_server = ptVar4;
    ptVar4 = newtree234(share_xchannel_us_cmp);
    cs_00->xchannels_by_us = ptVar4;
    ptVar4 = newtree234(share_xchannel_server_cmp);
    cs_00->xchannels_by_server = ptVar4;
    ptVar4 = newtree234(share_forwarding_cmp);
    cs_00->forwardings = ptVar4;
    cs_00->globreq_tail = (share_globreq *)0x0;
    cs_00->globreq_head = (share_globreq *)0x0;
    pi = sk_peer_info(cs_00->sock);
    bVar5 = false;
    if (pi != (SocketPeerInfo *)0x0) {
      bVar5 = pi->log_text != (char *)0x0;
    }
    pcVar3 = anon_var_dwarf_23ee3 + 10;
    if (bVar5) {
      pcVar3 = " from ";
    }
    if ((pi == (SocketPeerInfo *)0x0) || (pi->log_text == (char *)0x0)) {
      local_68 = anon_var_dwarf_23ee3 + 10;
    }
    else {
      local_68 = pi->log_text;
    }
    log_downstream(cs_00,"connected%s%s",pcVar3,local_68);
    sk_free_peer_info(pi);
    ctx_local._4_4_ = 0;
  }
  else {
    safefree(cs_00);
    ctx_local._4_4_ = ZEXT14(pcVar3 != (char *)0x0);
  }
  return ctx_local._4_4_;
}

Assistant:

static int share_listen_accepting(Plug *plug,
                                  accept_fn_t constructor, accept_ctx_t ctx)
{
    struct ssh_sharing_state *sharestate = container_of(
        plug, struct ssh_sharing_state, plug);
    struct ssh_sharing_connstate *cs;
    const char *err;
    SocketPeerInfo *peerinfo;

    /*
     * A new downstream has connected to us.
     */
    cs = snew(struct ssh_sharing_connstate);
    cs->plug.vt = &ssh_sharing_conn_plugvt;
    cs->parent = sharestate;

    if ((cs->id = share_find_unused_id(sharestate, sharestate->nextid)) == 0 &&
        (cs->id = share_find_unused_id(sharestate, 1)) == 0) {
        sfree(cs);
        return 1;
    }
    sharestate->nextid = cs->id + 1;
    if (sharestate->nextid == 0)
        sharestate->nextid++; /* only happens in VERY long-running upstreams */

    cs->sock = constructor(ctx, &cs->plug);
    if ((err = sk_socket_error(cs->sock)) != NULL) {
        sfree(cs);
        return err != NULL;
    }

    sk_set_frozen(cs->sock, false);

    add234(cs->parent->connections, cs);

    cs->sent_verstring = false;
    if (sharestate->server_verstring)
        share_send_verstring(cs);

    cs->got_verstring = false;
    cs->recvlen = 0;
    cs->crLine = 0;
    cs->halfchannels = newtree234(share_halfchannel_cmp);
    cs->channels_by_us = newtree234(share_channel_us_cmp);
    cs->channels_by_server = newtree234(share_channel_server_cmp);
    cs->xchannels_by_us = newtree234(share_xchannel_us_cmp);
    cs->xchannels_by_server = newtree234(share_xchannel_server_cmp);
    cs->forwardings = newtree234(share_forwarding_cmp);
    cs->globreq_head = cs->globreq_tail = NULL;

    peerinfo = sk_peer_info(cs->sock);
    log_downstream(cs, "connected%s%s",
                   (peerinfo && peerinfo->log_text ? " from " : ""),
                   (peerinfo && peerinfo->log_text ? peerinfo->log_text : ""));
    sk_free_peer_info(peerinfo);

    return 0;
}